

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_trainFromBuffer_legacy
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_legacy_params_t params)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ZDICT_legacy_params_t ZVar4;
  uint acc;
  uint uVar5;
  int iVar6;
  uint uVar7;
  U32 UVar8;
  U32 UVar9;
  ulong uVar10;
  uchar *T;
  dictItem *table;
  int *__ptr;
  void *pvVar11;
  void *__s;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  clock_t cVar15;
  uint uVar16;
  long lVar17;
  ulong *puVar18;
  ulong uVar19;
  dictItem *pdVar20;
  U32 *pUVar21;
  uint uVar22;
  U32 UVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  undefined8 uVar28;
  uint uVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong uVar32;
  uchar uVar33;
  char *pStart_2;
  size_t sVar34;
  U32 l;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  int *SA;
  ulong uVar39;
  size_t total;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  dictItem elt;
  dictItem elt_00;
  ulong local_3c0;
  char *pStart_4;
  long local_388;
  ZDICT_params_t local_338 [2];
  int aiStack_31c [56];
  uint local_23c;
  uint local_238 [5];
  undefined4 local_224;
  uint auStack_21c [57];
  uint local_138 [63];
  uint local_3c;
  
  ZVar4 = params;
  if (nbSamples == 0) {
    return 0;
  }
  uVar10 = 0;
  uVar40 = 0;
  do {
    uVar40 = uVar40 + samplesSizes[uVar10];
    uVar10 = uVar10 + 1;
  } while (nbSamples != uVar10);
  if (uVar40 < 0x200) {
    return 0;
  }
  T = (uchar *)malloc(uVar40 + 0x20);
  if (T == (uchar *)0x0) {
    return 0xffffffffffffffc0;
  }
  memcpy(T,samplesBuffer,uVar40);
  uVar5 = 0x9e3779b1;
  lVar17 = 0;
  do {
    uVar5 = uVar5 * -0x7a143589;
    T[lVar17 + uVar40] = (uchar)(uVar5 >> 0x15);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x20);
  uVar5 = (uint)(dictBufferCapacity >> 4);
  if (uVar5 < nbSamples) {
    uVar5 = nbSamples;
  }
  uVar10 = 10000;
  if (10000 < uVar5) {
    uVar10 = (ulong)uVar5;
  }
  table = (dictItem *)malloc(uVar10 * 0xc);
  uVar5 = 9;
  if (params.selectivityLevel != 0) {
    uVar5 = params.selectivityLevel;
  }
  uVar40 = 0;
  uVar41 = 0;
  do {
    uVar41 = uVar41 + samplesSizes[uVar40];
    uVar40 = uVar40 + 1;
  } while (nbSamples != uVar40);
  uVar24 = nbSamples >> ((byte)uVar5 & 0x1f);
  if (0x1e < uVar5) {
    uVar24 = 4;
  }
  if (table == (dictItem *)0x0) {
    sVar34 = 0xffffffffffffffc0;
    goto LAB_001a4d49;
  }
  sVar34 = 0xffffffffffffffba;
  if (0xff < dictBufferCapacity) {
    if (0x1ff < uVar41) {
      table->pos = 1;
      table->length = 0;
      table->savings = 0xffffffff;
      __ptr = (int *)malloc(uVar41 * 4 + 8);
      pvVar11 = malloc(uVar41 * 4);
      __s = malloc(uVar41 + 0x10);
      auVar3._8_8_ = 0;
      auVar3._0_4_ = params.zParams.compressionLevel;
      auVar3._4_4_ = params.zParams.notificationLevel;
      uVar28 = extractps(auVar3,1);
      uVar27 = (uint)uVar28;
      if (1 < uVar27) {
        ZDICT_trainFromBuffer_legacy_cold_1();
      }
      uVar40 = 1;
      if (__s != (void *)0x0 && (pvVar11 != (void *)0x0 && __ptr != (int *)0x0)) {
        uVar38 = 4;
        if (4 < uVar24) {
          uVar38 = uVar24;
        }
        uVar35 = uVar38;
        memset(__s,0,uVar41 + 0x10);
        uVar12 = uVar41;
        if ((uVar27 < 3) || (uVar41 < 0x7d000001)) {
          if (0x7d000000 < uVar41) goto LAB_001a4154;
        }
        else {
          ZDICT_trainFromBuffer_legacy_cold_2();
LAB_001a4154:
          uVar40 = (ulong)nbSamples;
          do {
            uVar40 = (ulong)((int)uVar40 - 1);
            uVar12 = uVar12 - samplesSizes[uVar40];
          } while (0x7d000000 < uVar12);
        }
        SA = __ptr + 1;
        if (1 < uVar27) {
          ZDICT_trainFromBuffer_legacy_cold_3();
        }
        iVar25 = (int)uVar12;
        iVar6 = divsufsort(T,SA,iVar25,uVar35);
        if (iVar6 == 0) {
          __ptr[uVar12 + 1] = iVar25;
          *__ptr = iVar25;
          if (uVar12 != 0) {
            uVar40 = 0;
            do {
              *(int *)((long)pvVar11 + (long)SA[uVar40] * 4) = (int)uVar40;
              uVar40 = uVar40 + 1;
            } while (uVar12 != uVar40);
          }
          uVar40 = 1;
          if (1 < uVar27) {
            ZDICT_trainFromBuffer_legacy_cold_4();
          }
          if (uVar12 != 0) {
            uVar40 = 0;
            local_388 = 0;
            uVar35 = 0;
            do {
              if (*(char *)((long)__s + uVar40) == '\0') {
                uVar22 = *(uint *)((long)pvVar11 + uVar40 * 4);
                memset(local_238,0,0x100);
                lVar17 = (long)SA[uVar22];
                *(undefined1 *)((long)__s + lVar17) = 1;
                puVar1 = (ulong *)(T + lVar17);
                if (((*(short *)(T + lVar17) == *(short *)(T + lVar17 + 2)) ||
                    (*(short *)((long)puVar1 + 1) == *(short *)((long)puVar1 + 3))) ||
                   (*(short *)(T + lVar17 + 2) == *(short *)((long)puVar1 + 4))) {
                  iVar6 = -4;
                  uVar40 = 6;
                  do {
                    uVar32 = uVar40;
                    iVar6 = iVar6 + -2;
                    uVar40 = (ulong)((int)uVar32 + 2);
                  } while (*(short *)((long)puVar1 + uVar32) == *(short *)((long)puVar1 + 4));
                  if (iVar6 != 0) {
                    uVar22 = (uint)(*(char *)((long)puVar1 + (uVar32 - 1)) ==
                                   (char)*(short *)((long)puVar1 + uVar32)) - iVar6;
                    if (uVar22 < 3) {
                      uVar22 = 2;
                    }
                    memset((void *)((long)__s + lVar17 + 1),1,(ulong)(uVar22 - 1));
                  }
                }
                else {
                  uVar40 = *puVar1;
                  uVar32 = (ulong)uVar22;
                  iVar6 = 1;
                  do {
                    iVar25 = iVar6;
                    uVar36 = (int)uVar32 + 1;
                    uVar32 = (ulong)uVar36;
                    uVar39 = *(ulong *)(T + SA[uVar32]);
                    puVar18 = puVar1;
                    uVar31 = uVar40;
                    if (uVar39 == uVar40) {
                      puVar30 = (ulong *)(T + (long)SA[uVar32] + 8);
                      do {
                        uVar39 = *puVar30;
                        uVar31 = puVar18[1];
                        puVar18 = puVar18 + 1;
                        puVar30 = puVar30 + 1;
                      } while (uVar39 == uVar31);
                    }
                    uVar26 = 0;
                    if ((uVar39 ^ uVar31) != 0) {
                      for (; ((uVar39 ^ uVar31) >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar39 = (ulong)uVar22;
                    iVar6 = iVar25 + 1;
                  } while (6 < (long)puVar18 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar1));
                  do {
                    iVar6 = iVar25;
                    uVar26 = uVar39;
                    uVar39 = *(ulong *)(T + __ptr[uVar26]);
                    puVar18 = puVar1;
                    uVar31 = uVar40;
                    if (uVar39 == uVar40) {
                      puVar30 = (ulong *)(T + (long)__ptr[uVar26] + 8);
                      do {
                        uVar39 = *puVar30;
                        uVar31 = puVar18[1];
                        puVar18 = puVar18 + 1;
                        puVar30 = puVar30 + 1;
                      } while (uVar39 == uVar31);
                    }
                    uVar14 = 0;
                    if ((uVar39 ^ uVar31) != 0) {
                      for (; ((uVar39 ^ uVar31) >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    uVar22 = (uint)uVar26;
                    uVar39 = (ulong)(uVar22 - 1);
                    iVar25 = iVar6 + 1;
                  } while (6 < (long)puVar18 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar1));
                  if (uVar36 - uVar22 < uVar38) {
                    if (uVar22 < uVar36) {
                      piVar13 = SA + uVar26;
                      do {
                        *(undefined1 *)((long)__s + (long)*piVar13) = 1;
                        piVar13 = piVar13 + 1;
                        iVar6 = iVar6 + -1;
                      } while (iVar6 != 0);
                    }
                  }
                  else {
                    if (3 < uVar27) {
                      ZDICT_trainFromBuffer_legacy_cold_5();
                    }
                    iVar6 = 7;
                    while( true ) {
                      uVar29 = 0;
                      uVar7 = (uint)uVar26;
                      uVar22 = 0;
                      uVar36 = uVar7;
                      uVar16 = uVar7;
                      if (uVar7 < (uint)uVar32) {
                        uVar22 = 0;
                        uVar29 = 0;
                        uVar33 = '\0';
                        uVar40 = uVar26;
                        uVar39 = uVar26;
                        uVar31 = uVar26;
                        do {
                          if (T[(uint)(SA[uVar31] + iVar6)] != uVar33) {
                            if (uVar22 < uVar29) {
                              uVar40 = uVar39;
                              uVar22 = uVar29;
                            }
                            uVar29 = 0;
                            uVar39 = uVar31 & 0xffffffff;
                            uVar33 = T[(uint)(SA[uVar31] + iVar6)];
                          }
                          uVar16 = (uint)uVar39;
                          uVar36 = (uint)uVar40;
                          uVar29 = uVar29 + 1;
                          uVar31 = uVar31 + 1;
                        } while (uVar32 != uVar31);
                      }
                      uVar37 = uVar22;
                      if (uVar22 < uVar29) {
                        uVar37 = uVar29;
                      }
                      if (uVar37 < uVar38) break;
                      if (uVar22 < uVar29) {
                        uVar36 = uVar16;
                      }
                      uVar32 = (ulong)(uVar37 + uVar36);
                      iVar6 = iVar6 + 1;
                      uVar26 = (ulong)uVar36;
                    }
                    uVar22 = SA[uVar26];
                    uVar39 = (ulong)(int)uVar22;
                    memset(local_338,0,0x100);
                    puVar1 = (ulong *)(T + uVar39);
                    uVar40 = *(ulong *)(T + uVar39);
                    uVar32 = uVar26;
                    do {
                      uVar36 = (int)uVar32 + 1;
                      uVar32 = (ulong)uVar36;
                      uVar31 = *(ulong *)(T + SA[uVar32]);
                      puVar18 = puVar1;
                      uVar14 = uVar40;
                      if (uVar31 == uVar40) {
                        puVar30 = (ulong *)(T + (long)SA[uVar32] + 8);
                        do {
                          uVar31 = *puVar30;
                          uVar14 = puVar18[1];
                          puVar18 = puVar18 + 1;
                          puVar30 = puVar30 + 1;
                        } while (uVar31 == uVar14);
                      }
                      uVar19 = 0;
                      if ((uVar31 ^ uVar14) != 0) {
                        for (; ((uVar31 ^ uVar14) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                        }
                      }
                      uVar31 = (long)puVar18 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar1);
                      uVar16 = 0x3f;
                      if (uVar31 < 0x3f) {
                        uVar16 = (uint)uVar31;
                      }
                      (&local_338[0].compressionLevel)[uVar16] =
                           (&local_338[0].compressionLevel)[uVar16] + 1;
                    } while (6 < uVar31);
                    if (uVar7 == 0) {
                      uVar16 = 0;
                    }
                    else {
                      do {
                        uVar16 = (int)uVar26 - 1;
                        uVar31 = *(ulong *)(T + SA[uVar16]);
                        puVar18 = puVar1;
                        uVar14 = uVar40;
                        if (uVar31 == uVar40) {
                          puVar30 = (ulong *)(T + (long)SA[uVar16] + 8);
                          do {
                            uVar31 = *puVar30;
                            uVar14 = puVar18[1];
                            puVar18 = puVar18 + 1;
                            puVar30 = puVar30 + 1;
                          } while (uVar31 == uVar14);
                        }
                        uVar19 = 0;
                        if ((uVar31 ^ uVar14) != 0) {
                          for (; ((uVar31 ^ uVar14) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                          }
                        }
                        uVar31 = (long)puVar18 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar1);
                        uVar7 = 0x3f;
                        if (uVar31 < 0x3f) {
                          uVar7 = (uint)uVar31;
                        }
                        (&local_338[0].compressionLevel)[uVar7] =
                             (&local_338[0].compressionLevel)[uVar7] + 1;
                        if (6 < uVar31) {
                          uVar26 = (ulong)uVar16;
                        }
                        uVar16 = (uint)uVar26;
                      } while ((6 < uVar31) && (uVar16 != 0));
                    }
                    memset(local_138,0,0x100);
                    local_3c = local_23c;
                    lVar17 = 0x3e;
                    uVar7 = local_23c;
                    do {
                      uVar7 = uVar7 + (&local_338[0].compressionLevel)[lVar17];
                      local_138[lVar17] = uVar7;
                      bVar42 = lVar17 != 0;
                      lVar17 = lVar17 + -1;
                    } while (bVar42);
                    uVar40 = 0x3f;
                    do {
                      uVar7 = (uint)uVar40;
                      if (uVar38 <= local_138[uVar40]) goto LAB_001a463b;
                      uVar40 = (ulong)(uVar7 - 1);
                    } while (7 < uVar7);
                    uVar40 = 6;
LAB_001a463b:
                    uVar31 = uVar40;
                    uVar7 = (int)uVar40 + 1;
                    do {
                      uVar29 = uVar7;
                      uVar26 = uVar31;
                      uVar37 = (uint)uVar26;
                      uVar31 = (ulong)(uVar37 - 1);
                      uVar7 = uVar29 - 1;
                    } while (*(char *)((long)puVar1 + (uVar26 - 2)) ==
                             *(char *)((long)puVar1 + (long)(int)uVar40 + -1));
                    if (6 < uVar37) {
                      local_224 = 0;
                      if (6 < (int)uVar37) {
                        uVar40 = 7;
                        uVar7 = 0;
                        do {
                          uVar7 = uVar7 + ((int)uVar40 + -3) *
                                          (&local_338[0].compressionLevel)[uVar40];
                          local_238[uVar40] = uVar7;
                          uVar40 = uVar40 + 1;
                        } while (uVar29 != uVar40);
                      }
                      if (uVar27 < 4) {
                        uVar7 = local_238[uVar26];
                      }
                      else {
                        uVar7 = local_238[uVar26];
                        fprintf(_stderr,
                                "Selected dict at position %u, of length %u : saves %u (ratio: %.2f)  \n"
                                ,SUB84((double)uVar7 / (double)uVar26,0),uVar39);
                        fflush(_stderr);
                      }
                      if (uVar16 < uVar36) {
                        uVar40 = (ulong)uVar16;
                        do {
                          uVar36 = SA[uVar40];
                          uVar31 = (ulong)uVar36;
                          uVar16 = uVar37;
                          if (uVar31 != uVar39) {
                            uVar14 = *(ulong *)(T + uVar31);
                            uVar19 = *puVar1;
                            puVar18 = puVar1;
                            if (uVar14 == uVar19) {
                              puVar30 = (ulong *)(T + uVar31 + 8);
                              do {
                                uVar14 = *puVar30;
                                uVar19 = puVar18[1];
                                puVar18 = puVar18 + 1;
                                puVar30 = puVar30 + 1;
                              } while (uVar14 == uVar19);
                            }
                            uVar2 = 0;
                            if ((uVar14 ^ uVar19) != 0) {
                              for (; ((uVar14 ^ uVar19) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                              }
                            }
                            uVar16 = ((int)puVar18 + ((uint)(uVar2 >> 3) & 0x1fffffff)) -
                                     (int)puVar1;
                            if (uVar37 < uVar16) {
                              uVar16 = uVar37;
                            }
                          }
                          if (uVar36 < uVar16 + uVar36) {
                            memset((void *)(uVar31 + (long)__s),1,(ulong)(uVar16 - 1) + 1);
                          }
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != uVar32);
                      }
                      elt._0_8_ = (uVar26 << 0x20) + (ulong)uVar22;
                      elt.savings = uVar7;
                      UVar8 = ZDICT_tryMerge(table,elt,0,T);
                      if (UVar8 == 0) {
                        uVar22 = table->pos;
                        if ((uint)uVar10 <= table->pos) {
                          uVar22 = (uint)uVar10 - 1;
                        }
                        uVar40 = (ulong)(uVar22 - 1);
                        uVar36 = table[uVar40].savings;
                        uVar16 = uVar22;
                        while (uVar36 < uVar7) {
                          pdVar20 = table + uVar40;
                          table[uVar16].savings = pdVar20->savings;
                          UVar8 = pdVar20->length;
                          table[uVar16].pos = pdVar20->pos;
                          table[uVar16].length = UVar8;
                          uVar40 = (ulong)(uVar16 - 2);
                          uVar16 = uVar16 - 1;
                          uVar36 = table[uVar40].savings;
                        }
                        *(long *)(table + uVar16) = elt._0_8_;
                        table[uVar16].savings = uVar7;
                        table->pos = uVar22 + 1;
                      }
                      else {
                        local_3c0 = (ulong)UVar8;
                        uVar28._0_4_ = table[local_3c0].pos;
                        uVar28._4_4_ = table[local_3c0].length;
                        UVar23 = table[local_3c0].savings;
                        while (elt_00.savings = UVar23, elt_00.pos = (int)uVar28,
                              elt_00.length = (int)((ulong)uVar28 >> 0x20),
                              UVar9 = ZDICT_tryMerge(table,elt_00,UVar8,T), UVar9 != 0) {
                          uVar22 = table->pos - 1;
                          if (UVar8 < uVar22) {
                            lVar17 = uVar22 - local_3c0;
                            pdVar20 = table + local_3c0;
                            do {
                              pdVar20->savings = pdVar20[1].savings;
                              UVar8 = pdVar20[1].length;
                              pdVar20->pos = pdVar20[1].pos;
                              pdVar20->length = UVar8;
                              pdVar20 = pdVar20 + 1;
                              lVar17 = lVar17 + -1;
                            } while (lVar17 != 0);
                            uVar22 = table->pos - 1;
                          }
                          table->pos = uVar22;
                          local_3c0 = (ulong)UVar9;
                          uVar28._0_4_ = table[local_3c0].pos;
                          uVar28._4_4_ = table[local_3c0].length;
                          UVar23 = table[local_3c0].savings;
                          UVar8 = UVar9;
                        }
                      }
                      uVar35 = uVar35 + (uVar37 - 1) + 1;
                      if ((1 < uVar27) && (cVar15 = clock(), 300000 < cVar15 - local_388)) {
                        local_388 = clock();
                        fprintf(_stderr,"\r%4.2f %% \r",
                                SUB84(((double)uVar35 / (double)(long)uVar12) * 100.0,0));
                        fflush(_stderr);
                        if (3 < uVar27) {
                          fflush(_stderr);
                        }
                      }
                      goto LAB_001a4321;
                    }
                  }
                }
                uVar35 = uVar35 + 1;
              }
              else {
                uVar35 = uVar35 + 1;
              }
LAB_001a4321:
              uVar40 = (ulong)uVar35;
            } while (uVar40 < uVar12);
            uVar40 = (ulong)table->pos;
          }
        }
        else {
          uVar40 = 1;
        }
      }
      uVar38 = (uint)uVar40;
      free(__ptr);
      free(pvVar11);
      free(__s);
      if (2 < uVar27) {
        uVar35 = 0x19;
        if (uVar38 < 0x19) {
          uVar35 = uVar38;
        }
        if (uVar38 < 2) {
          ZDICT_trainFromBuffer_legacy_cold_6();
          goto LAB_001a4d3a;
        }
        lVar17 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)(uint)((int)uVar10 + *(int *)((long)&table[1].length + lVar17));
          lVar17 = lVar17 + 0xc;
        } while (uVar40 * 0xc + -0xc != lVar17);
        fprintf(_stderr,"\n %u segments found, of total size %u \n",(ulong)(uVar38 - 1),uVar10);
        fflush(_stderr);
        fprintf(_stderr,"list %u best segments \n",(ulong)(uVar35 - 1));
        fflush(_stderr);
        pUVar21 = &table[1].savings;
        uVar10 = 1;
        do {
          uVar12 = (ulong)((dictItem *)(pUVar21 + -2))->pos;
          sVar34 = 0xffffffffffffffff;
          if (uVar41 < uVar12) goto LAB_001a4d41;
          uVar22 = pUVar21[-1];
          if (uVar41 < uVar22 + ((dictItem *)(pUVar21 + -2))->pos) goto LAB_001a4d41;
          sVar34 = 0x28;
          if (uVar22 < 0x28) {
            sVar34 = (size_t)uVar22;
          }
          fprintf(_stderr,"%3u:%3u bytes at pos %8u, savings %7u bytes |",uVar10,(ulong)uVar22,
                  uVar12,(ulong)*pUVar21);
          fflush(_stderr);
          ZDICT_printHex(T + uVar12,sVar34);
          fwrite("| \n",3,1,_stderr);
          fflush(_stderr);
          uVar10 = uVar10 + 1;
          pUVar21 = pUVar21 + 3;
        } while (uVar35 != uVar10);
      }
      if (1 < uVar38) {
        lVar17 = 0;
        uVar38 = 0;
        do {
          uVar38 = uVar38 + *(int *)((long)&table[1].length + lVar17);
          lVar17 = lVar17 + 0xc;
        } while (uVar40 * 0xc + -0xc != lVar17);
        sVar34 = 0xffffffffffffffde;
        if (0x7f < uVar38) {
          if ((1 < uVar27) && ((ulong)uVar38 < dictBufferCapacity >> 2)) {
            fprintf(_stderr,
                    "!  warning : selected content significantly smaller than requested (%u < %u) \n"
                    ,(ulong)uVar38,dictBufferCapacity & 0xffffffff);
            fflush(_stderr);
            if (uVar41 < dictBufferCapacity * 10) {
              ZDICT_trainFromBuffer_legacy_cold_7();
            }
            if (4 < uVar24) {
              ZDICT_trainFromBuffer_legacy_cold_8();
            }
          }
          if ((1 < uVar5 && 8 < nbSamples) && dictBufferCapacity * 3 < (ulong)uVar38) {
            do {
              uVar5 = uVar5 - 1;
            } while (nbSamples >> ((byte)uVar5 & 0x1f) < 5);
            if (1 < uVar27) {
              ZDICT_trainFromBuffer_legacy_cold_9();
            }
          }
          pUVar21 = &table[1].length;
          uVar10 = 1;
          uVar5 = 0;
          do {
            uVar24 = *pUVar21 + uVar5;
            uVar41 = uVar10;
            if (dictBufferCapacity < uVar24) break;
            uVar10 = uVar10 + 1;
            pUVar21 = pUVar21 + 3;
            uVar41 = uVar40;
            uVar5 = uVar24;
          } while (uVar40 != uVar10);
          if (1 < (uint)uVar41) {
            pvVar11 = (void *)((long)dictBuffer + dictBufferCapacity);
            lVar17 = 0;
            do {
              uVar10 = (ulong)*(uint *)((long)&table[1].length + lVar17);
              pvVar11 = (void *)((long)pvVar11 - uVar10);
              if (pvVar11 < dictBuffer) {
                sVar34 = 0xffffffffffffffff;
                goto LAB_001a4d41;
              }
              memcpy(pvVar11,T + *(uint *)((long)&table[1].pos + lVar17),uVar10);
              lVar17 = lVar17 + 0xc;
            } while ((uVar41 & 0xffffffff) * 0xc + -0xc != lVar17);
          }
          local_338[0].compressionLevel = params.zParams.compressionLevel;
          local_338[0].notificationLevel = params.zParams.notificationLevel;
          local_338[0].dictID = params.zParams.dictID;
          sVar34 = ZDICT_addEntropyTablesFromBuffer_advanced
                             (dictBuffer,(ulong)uVar5,dictBufferCapacity,T,samplesSizes,nbSamples,
                              ZVar4.zParams);
        }
        goto LAB_001a4d41;
      }
    }
LAB_001a4d3a:
    sVar34 = 0xffffffffffffffde;
  }
LAB_001a4d41:
  free(table);
LAB_001a4d49:
  free(T);
  return sVar34;
}

Assistant:

size_t ZDICT_trainFromBuffer_legacy(void* dictBuffer, size_t dictBufferCapacity,
                              const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
                              ZDICT_legacy_params_t params)
{
    size_t result;
    void* newBuff;
    size_t const sBuffSize = ZDICT_totalSampleSize(samplesSizes, nbSamples);
    if (sBuffSize < ZDICT_MIN_SAMPLES_SIZE) return 0;   /* not enough content => no dictionary */

    newBuff = malloc(sBuffSize + NOISELENGTH);
    if (!newBuff) return ERROR(memory_allocation);

    memcpy(newBuff, samplesBuffer, sBuffSize);
    ZDICT_fillNoise((char*)newBuff + sBuffSize, NOISELENGTH);   /* guard band, for end of buffer condition */

    result =
        ZDICT_trainFromBuffer_unsafe_legacy(dictBuffer, dictBufferCapacity, newBuff,
                                            samplesSizes, nbSamples, params);
    free(newBuff);
    return result;
}